

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O3

StringTree * __thiscall
kj::strTree<kj::String,kj::String>
          (StringTree *__return_storage_ptr__,kj *this,String *params,String *params_1)

{
  char *pcVar1;
  size_t sVar2;
  Branch *pBVar3;
  StringTree local_78;
  StringTree local_40;
  
  local_40.text.content.size_ = *(size_t *)(this + 8);
  local_40.size_ = local_40.text.content.size_ - 1;
  if (local_40.text.content.size_ == 0) {
    local_40.size_ = 0;
  }
  local_40.text.content.ptr = *(char **)this;
  local_40.text.content.disposer = *(ArrayDisposer **)(this + 0x10);
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  local_40.branches.disposer = (ArrayDisposer *)0x0;
  local_40.branches.ptr = (Branch *)0x0;
  local_40.branches.size_ = 0;
  local_78.text.content.size_ = (params->content).size_;
  local_78.size_ = local_78.text.content.size_ - 1;
  if (local_78.text.content.size_ == 0) {
    local_78.size_ = 0;
  }
  local_78.text.content.ptr = (params->content).ptr;
  local_78.text.content.disposer = (params->content).disposer;
  (params->content).ptr = (char *)0x0;
  (params->content).size_ = 0;
  local_78.branches.disposer = (ArrayDisposer *)0x0;
  local_78.branches.ptr = (Branch *)0x0;
  local_78.branches.size_ = 0;
  StringTree::concat<kj::StringTree,kj::StringTree>
            (__return_storage_ptr__,&local_40,&local_78,&local_78);
  sVar2 = local_78.branches.size_;
  pBVar3 = local_78.branches.ptr;
  if (local_78.branches.ptr != (Branch *)0x0) {
    local_78.branches.ptr = (Branch *)0x0;
    local_78.branches.size_ = 0;
    (**(local_78.branches.disposer)->_vptr_ArrayDisposer)
              (local_78.branches.disposer,pBVar3,0x40,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  sVar2 = local_78.text.content.size_;
  pcVar1 = local_78.text.content.ptr;
  if (local_78.text.content.ptr != (char *)0x0) {
    local_78.text.content.ptr = (char *)0x0;
    local_78.text.content.size_ = 0;
    (**(local_78.text.content.disposer)->_vptr_ArrayDisposer)
              (local_78.text.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  sVar2 = local_40.branches.size_;
  pBVar3 = local_40.branches.ptr;
  if (local_40.branches.ptr != (Branch *)0x0) {
    local_40.branches.ptr = (Branch *)0x0;
    local_40.branches.size_ = 0;
    (**(local_40.branches.disposer)->_vptr_ArrayDisposer)
              (local_40.branches.disposer,pBVar3,0x40,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  sVar2 = local_40.text.content.size_;
  pcVar1 = local_40.text.content.ptr;
  if (local_40.text.content.ptr != (char *)0x0) {
    local_40.text.content.ptr = (char *)0x0;
    local_40.text.content.size_ = 0;
    (**(local_40.text.content.disposer)->_vptr_ArrayDisposer)
              (local_40.text.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  return __return_storage_ptr__;
}

Assistant:

StringTree strTree(Params&&... params) {
  return StringTree::concat(_::toStringTreeOrCharSequence(kj::fwd<Params>(params))...);
}